

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::web_peer_connection::on_receive
          (web_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  _Atomic_word *p_Var1;
  uint *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  web_seed_t *pwVar4;
  _Elt_pointer pfVar5;
  pointer pcVar6;
  undefined1 auVar7 [16];
  span<const_char> sVar8;
  span<const_char> sVar9;
  span<const_char> sVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  _Rb_tree_node_base *p_Var13;
  string *psVar14;
  uint uVar15;
  int iVar16;
  element_type *peVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  file_request_t *file_req;
  bool *error_00;
  undefined1 this_00 [8];
  span<const_char> buf;
  string_view key;
  span<const_char> sVar23;
  span<const_char> sVar24;
  char *local_b0;
  int header_size;
  error_code ec;
  size_type local_90 [3];
  bool failed;
  undefined1 auStack_77 [15];
  undefined1 local_68 [8];
  int64_t chunk_size;
  _Alloc_hider local_58;
  receive_buffer *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  if (error->failed_ == true) {
    peer_connection::received_bytes((peer_connection *)this,0,(int)bytes_transferred);
    bVar12 = peer_connection::should_log((peer_connection *)this,info);
    if (bVar12) {
      (*error->cat_->_vptr_error_category[4])(&ec,error->cat_,(ulong)(uint)error->val_);
      peer_connection::peer_log
                ((peer_connection *)this,info,"ERROR","web_peer_connection error: %s",ec._0_8_);
      if ((size_type *)ec._0_8_ != local_90) {
        operator_delete((void *)ec._0_8_,local_90[0] + 1);
      }
    }
  }
  else {
    peVar17 = (this->super_web_connection_base).super_peer_connection.
              super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (this->super_web_connection_base).super_peer_connection.
             super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    this_00 = (undefined1  [8])p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar18 = p_Var3->_M_use_count;
        do {
          this_00 = (undefined1  [8])(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar18 == 0) break;
          LOCK();
          iVar16 = p_Var3->_M_use_count;
          bVar12 = iVar18 == iVar16;
          if (bVar12) {
            p_Var3->_M_use_count = iVar18 + 1;
            iVar16 = iVar18;
          }
          iVar18 = iVar16;
          UNLOCK();
          this_00 = (undefined1  [8])p_Var3;
        } while (!bVar12);
      }
    }
    if (this_00 == (undefined1  [8])0x0) {
      peVar17 = (element_type *)0x0;
    }
    else if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count == 0) {
      peVar17 = (element_type *)0x0;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar18 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar18 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar18 + -1;
      }
      if (iVar18 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])();
      }
    }
    local_50 = &(this->super_web_connection_base).super_peer_connection.m_recv_buffer;
    local_48._M_allocated_capacity = (size_type)peVar17;
    sVar23 = receive_buffer::get(local_50);
    handle_padfile(this);
    p_Var3 = (this->super_web_connection_base).super_peer_connection.
             super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    bVar12 = true;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar12 = p_Var3->_M_use_count == 0;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar18 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar18 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar18 + -1;
      }
      if (iVar18 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])();
      }
    }
    if (!bVar12) {
      local_90[2] = (size_type)&(this->super_web_connection_base).m_parser;
      local_38._M_p =
           (pointer)&(this->super_web_connection_base).m_parser.m_header._M_t._M_impl.
                     super__Rb_tree_header;
      local_48._8_8_ = &(this->super_web_connection_base).m_server_string;
      local_58._M_p = (pointer)&this->m_file_requests;
      local_68 = this_00;
      do {
        error_00 = (bool *)sVar23.m_len;
        local_b0 = sVar23.m_ptr;
        if ((this->super_web_connection_base).m_parser.m_state == read_body) {
LAB_003a291d:
          local_b0 = sVar23.m_ptr;
          if (sVar23.m_len == 0) {
            iVar16 = 6;
          }
          else {
            ec._0_8_ = ec._5_8_ << 0x28;
            ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                       super_error_category;
            if ((this->super_web_connection_base).m_parser.m_status_code == 0xce) {
              lVar19 = (this->super_web_connection_base).m_parser.m_range_start;
              lVar20 = (this->super_web_connection_base).m_parser.m_range_end;
              if (lVar20 < lVar19 || lVar19 < 0) {
                ec = errors::make_error_code(invalid_range);
LAB_003a2b86:
                lVar20 = 0;
                goto LAB_003a2b93;
              }
              lVar20 = lVar20 + 1;
            }
            else {
              lVar20 = (this->super_web_connection_base).m_parser.m_content_length;
              if (lVar20 < 0) {
                ec = errors::make_error_code(no_content_length);
                goto LAB_003a2b86;
              }
LAB_003a2b93:
              lVar19 = 0;
            }
            iVar18 = (int)sVar23.m_len;
            if (ec.failed_ == true) {
              peer_connection::received_bytes((peer_connection *)this,0,iVar18);
              iVar16 = 1;
              disable(this,&ec);
            }
            else {
              pfVar5 = (this->m_file_requests).
                       super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              if ((lVar19 == pfVar5->start) && (lVar20 == pfVar5->start + (long)pfVar5->length)) {
                if ((this->super_web_connection_base).m_parser.m_chunked_encoding == true) {
                  do {
                    local_b0 = sVar23.m_ptr;
                    iVar18 = this->m_chunk_pos;
                    if ((iVar18 < 0) || (sVar23.m_len == 0)) goto LAB_003a312d;
                    if (0 < iVar18) {
                      iVar16 = (int)sVar23.m_len;
                      if (iVar16 <= iVar18) {
                        iVar18 = iVar16;
                      }
                      if (pfVar5->length < this->m_received_body + iVar18) {
                        peer_connection::received_bytes((peer_connection *)this,0,iVar16);
                        peer_connection::peer_log
                                  ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                                   "received body: %d request size: %d",
                                   (ulong)(uint)this->m_received_body,(ulong)(uint)pfVar5->length);
                        _failed = errors::make_error_code(invalid_range);
                        (*(this->super_web_connection_base).super_peer_connection.
                          super_bandwidth_socket._vptr_bandwidth_socket[0x14])(this,&failed,1,2);
                        bVar12 = false;
                        iVar16 = 1;
                      }
                      else {
                        incoming_payload(this,local_b0,iVar18);
                        this->m_chunk_pos = this->m_chunk_pos - iVar18;
                        lVar20 = sVar23.m_len - (long)iVar18;
                        sVar23.m_len = lVar20;
                        sVar23.m_ptr = local_b0 + iVar18;
                        bVar12 = lVar20 != 0;
                        iVar16 = 0x1a;
                        if (bVar12) {
                          iVar16 = 0;
                        }
                      }
                      if (!bVar12) goto LAB_003a313d;
                    }
                    local_b0 = sVar23.m_ptr;
                    header_size = 0;
                    chunk_size = 0;
                    lVar20 = sVar23.m_len - (long)this->m_chunk_pos;
                    buf.m_len = lVar20;
                    buf.m_ptr = local_b0 + this->m_chunk_pos;
                    bVar12 = http_parser::parse_chunk_header
                                       ((http_parser *)local_90[2],buf,&chunk_size,&header_size);
                    if (bVar12) {
                      peer_connection::peer_log
                                ((peer_connection *)this,info,"CHUNKED_ENCODING",
                                 "parsed chunk: %ld header_size: %d",chunk_size,
                                 (ulong)(uint)header_size);
                      peer_connection::received_bytes
                                ((peer_connection *)this,0,
                                 header_size - this->m_partial_chunk_header);
                      this->m_partial_chunk_header = 0;
                      this->m_chunk_pos = this->m_chunk_pos + (int)chunk_size;
                      local_b0 = local_b0 + header_size;
                      lVar20 = sVar23.m_len - (long)header_size;
                      sVar9.m_len = lVar20;
                      sVar9.m_ptr = local_b0;
                      sVar8.m_len = lVar20;
                      sVar8.m_ptr = local_b0;
                      sVar23.m_len = lVar20;
                      sVar23.m_ptr = local_b0;
                      if (chunk_size == 0) {
                        this->m_chunk_pos = -1;
                        if (this->m_received_body == pfVar5->length) {
                          ::std::
                          deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                          ::pop_front((deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                       *)local_58._M_p);
                          http_parser::reset((http_parser *)local_90[2]);
                          (this->super_web_connection_base).m_body_start = 0;
                          this->m_received_body = 0;
                          this->m_chunk_pos = 0;
                          this->m_partial_chunk_header = 0;
                          iVar16 = 0x17;
                          handle_padfile(this);
                          sVar23 = sVar8;
                        }
                        else {
                          peer_connection::received_bytes((peer_connection *)this,0,(int)lVar20);
                          peer_connection::peer_log
                                    ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                                     "received body: %d request size: %d",
                                     (ulong)(uint)this->m_received_body,(ulong)(uint)pfVar5->length)
                          ;
                          _failed = errors::make_error_code(invalid_range);
                          (*(this->super_web_connection_base).super_peer_connection.
                            super_bandwidth_socket._vptr_bandwidth_socket[0x14])(this,&failed,1,2);
                          iVar16 = 1;
                          sVar23 = sVar9;
                        }
                      }
                      else {
                        iVar16 = 0;
                        if (lVar20 == 0) {
                          iVar16 = 0x1a;
                        }
                      }
                    }
                    else {
                      iVar18 = (int)lVar20;
                      peer_connection::received_bytes
                                ((peer_connection *)this,0,iVar18 - this->m_partial_chunk_header);
                      this->m_partial_chunk_header = iVar18;
                      iVar16 = 0x1a;
                    }
                  } while (iVar16 == 0);
                  if (iVar16 != 0x17) goto LAB_003a313d;
                }
                else {
                  iVar16 = pfVar5->length - this->m_received_body;
                  if (iVar18 <= iVar16) {
                    iVar16 = iVar18;
                  }
                  incoming_payload(this,local_b0,iVar16);
                  lVar20 = sVar23.m_len - (long)iVar16;
                  sVar10.m_len = lVar20;
                  sVar10.m_ptr = local_b0 + iVar16;
                  sVar23.m_len = lVar20;
                  sVar23.m_ptr = local_b0 + iVar16;
                  if (this->m_received_body == pfVar5->length) {
                    ::std::
                    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                    ::pop_front((deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                 *)local_58._M_p);
                    http_parser::reset((http_parser *)local_90[2]);
                    (this->super_web_connection_base).m_body_start = 0;
                    this->m_received_body = 0;
                    this->m_chunk_pos = 0;
                    this->m_partial_chunk_header = 0;
                    handle_padfile(this);
                    sVar23 = sVar10;
                  }
                }
LAB_003a312d:
                iVar16 = 0;
                if (sVar23.m_len == 0) {
                  iVar16 = 6;
                }
              }
              else {
                peer_connection::received_bytes((peer_connection *)this,0,iVar18);
                bVar12 = peer_connection::should_log((peer_connection *)this,incoming);
                if (bVar12) {
                  uVar22 = (ulong)(uint)(pfVar5->file_index).m_val;
                  peer_connection::peer_log
                            ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                             "in=(%d, %ld-%ld) expected=(%d, %ld-%ld) ]",uVar22,lVar19,lVar20,uVar22
                             ,pfVar5->start,pfVar5->start + (long)pfVar5->length + -1);
                }
                _failed = errors::make_error_code(invalid_range);
                (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
                  _vptr_bandwidth_socket[0x14])(this,&failed,1,2);
                iVar16 = 1;
              }
            }
          }
        }
        else {
          auVar7[0xf] = 0;
          auVar7._0_15_ = auStack_77;
          _failed = (error_code)(auVar7 << 8);
          sVar24.m_len = (difference_type)local_b0;
          sVar24.m_ptr = (char *)local_90[2];
          http_parser::incoming((http_parser *)&ec,sVar24,error_00);
          peer_connection::received_bytes((peer_connection *)this,0,ec.val_);
          iVar18 = (int)sVar23.m_len;
          if (failed == true) {
            peer_connection::received_bytes((peer_connection *)this,0,iVar18);
            bVar12 = peer_connection::should_log((peer_connection *)this,info);
            if (bVar12) {
              peer_connection::peer_log
                        ((peer_connection *)this,info,"RECEIVE_BYTES","%*s",
                         (ulong)error_00 & 0xffffffff,local_b0);
            }
            ec = errors::make_error_code(http_parse_error);
            (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
              _vptr_bandwidth_socket[0x14])(this,(http_parser *)&ec,1,2);
            iVar16 = 1;
            bVar12 = false;
          }
          else {
            bVar12 = false;
            iVar16 = 6;
            if (((this->super_web_connection_base).m_parser.m_status_code != -1) &&
               ((this->super_web_connection_base).m_parser.m_state == read_body)) {
              (this->super_web_connection_base).m_body_start =
                   (this->super_web_connection_base).m_parser.m_body_start_pos;
              this->m_received_body = 0;
              iVar16 = 0;
              bVar12 = true;
            }
          }
          if (bVar12) {
            this->m_num_responses = this->m_num_responses + 1;
            if (((this->super_web_connection_base).m_parser.m_connection_close == true) &&
               (peer_connection::incoming_choke((peer_connection *)this), this->m_num_responses == 1
               )) {
              this->m_web->supports_keepalive = false;
            }
            bVar12 = peer_connection::should_log((peer_connection *)this,info);
            _Var11._M_p = local_38._M_p;
            if (bVar12) {
              peer_connection::peer_log
                        ((peer_connection *)this,info,"STATUS","%d %s",
                         (ulong)(uint)(this->super_web_connection_base).m_parser.m_status_code,
                         (this->super_web_connection_base).m_parser.m_server_message._M_dataplus.
                         _M_p);
              for (p_Var13 = (this->super_web_connection_base).m_parser.m_header._M_t._M_impl.
                             super__Rb_tree_header._M_header._M_left;
                  p_Var13 != (_Rb_tree_node_base *)_Var11._M_p;
                  p_Var13 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var13)) {
                peer_connection::peer_log
                          ((peer_connection *)this,info,"STATUS","   %s: %s",
                           *(undefined8 *)(p_Var13 + 1),*(undefined8 *)(p_Var13 + 2));
              }
            }
            bVar12 = is_ok_status((this->super_web_connection_base).m_parser.m_status_code);
            if (bVar12) {
              bVar12 = is_redirect((this->super_web_connection_base).m_parser.m_status_code);
              if (!bVar12) {
                key._M_str = "server";
                key._M_len = 6;
                psVar14 = http_parser::header_abi_cxx11_((http_parser *)local_90[2],key);
                if (psVar14->_M_string_length == 0) {
                  ec._0_8_ = local_90;
                  pcVar6 = (this->super_web_connection_base).m_host._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&ec,pcVar6,
                             pcVar6 + (this->super_web_connection_base).m_host._M_string_length);
                }
                else {
                  ec._0_8_ = local_90;
                  pcVar6 = (psVar14->_M_dataplus)._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&ec,pcVar6,pcVar6 + psVar14->_M_string_length);
                }
                ::std::__cxx11::string::operator=((string *)local_48._8_8_,(string *)&ec);
                if ((size_type *)ec._0_8_ != local_90) {
                  operator_delete((void *)ec._0_8_,local_90[0] + 1);
                }
                lVar20 = (long)(this->super_web_connection_base).m_body_start;
                sVar23.m_len = (long)error_00 - lVar20;
                sVar23.m_ptr = local_b0 + lVar20;
                (this->super_web_connection_base).m_body_start =
                     (this->super_web_connection_base).m_parser.m_body_start_pos;
                this->m_received_body = 0;
                goto LAB_003a291d;
              }
              iVar16 = 1;
              handle_redirect(this,iVar18);
            }
            else {
              pfVar5 = (this->m_file_requests).
                       super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              if ((this->m_file_requests).
                  super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur != pfVar5) {
                pwVar4 = this->m_web;
                iVar16 = file_storage::num_files
                                   (&((((shared_ptr<libtorrent::torrent_info> *)
                                       (local_48._M_allocated_capacity + 0x18))->
                                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->m_files);
                bitfield::resize(&(pwVar4->have_files).super_bitfield,iVar16,true);
                iVar16 = (pfVar5->file_index).m_val;
                uVar15 = ~(0x80000000U >> ((byte)iVar16 & 0x1f));
                iVar21 = iVar16 + 0x1f;
                if (-1 < iVar16) {
                  iVar21 = iVar16;
                }
                puVar2 = (uint *)((long)(this->m_web->have_files).super_bitfield.m_buf.
                                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  + 4 + (long)(iVar21 >> 5) * 4);
                *puVar2 = *puVar2 & (uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 |
                                     (uVar15 & 0xff00) << 8 | uVar15 << 0x18);
                peer_connection::peer_log
                          ((peer_connection *)this,info,"MISSING_FILE","http-code: %d | file: %d",
                           (ulong)(uint)(this->super_web_connection_base).m_parser.m_status_code,
                           (ulong)(uint)(pfVar5->file_index).m_val);
              }
              iVar16 = 1;
              handle_error(this,iVar18);
            }
          }
        }
LAB_003a313d:
        this_00 = local_68;
      } while (iVar16 == 0);
      if ((iVar16 == 6) || (iVar16 == 0x1a)) {
        sVar24 = receive_buffer::get(local_50);
        iVar18 = (((((shared_ptr<libtorrent::torrent_info> *)(local_48._M_allocated_capacity + 0x18)
                    )->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->m_files).m_piece_length;
        iVar16 = 0x4000;
        if (iVar18 < 0x4000) {
          iVar16 = iVar18;
        }
        iVar21 = 0x5388;
        if (0 < iVar18) {
          iVar21 = iVar16 + 5000;
        }
        receive_buffer::cut(local_50,(int)sVar23.m_ptr - (int)sVar24.m_ptr,iVar21,0);
      }
    }
    if (this_00 != (undefined1  [8])0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  return;
}

Assistant:

void web_peer_connection::on_receive(error_code const& error
	, std::size_t bytes_transferred)
{
	INVARIANT_CHECK;

	if (error)
	{
		received_bytes(0, int(bytes_transferred));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "ERROR"
				, "web_peer_connection error: %s", error.message().c_str());
		}
#endif
		return;
	}

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// in case the first file on this series of requests is a padfile
	// we need to handle it right now
	span<char const> recv_buffer = m_recv_buffer.get();
	handle_padfile();
	if (associated_torrent().expired()) return;

	for (;;)
	{
		int payload;
		int protocol;
		bool header_finished = m_parser.header_finished();
		if (!header_finished)
		{
			bool failed = false;
			std::tie(payload, protocol) = m_parser.incoming(recv_buffer, failed);
			received_bytes(0, protocol);
			TORRENT_ASSERT(int(recv_buffer.size()) >= protocol);

			if (failed)
			{
				received_bytes(0, int(recv_buffer.size()));
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::info))
				{
					peer_log(peer_log_alert::info, "RECEIVE_BYTES"
						, "%*s", int(recv_buffer.size()), recv_buffer.data());
				}
#endif
				disconnect(errors::http_parse_error, operation_t::bittorrent, peer_error);
				return;
			}

			TORRENT_ASSERT(recv_buffer.empty() || recv_buffer[0] == 'H');
			TORRENT_ASSERT(int(recv_buffer.size()) <= m_recv_buffer.packet_size());

			// this means the entire status line hasn't been received yet
			if (m_parser.status_code() == -1)
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			if (!m_parser.header_finished())
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we just completed reading the header
		if (!header_finished)
		{
			++m_num_responses;

			if (m_parser.connection_close())
			{
				incoming_choke();
				if (m_num_responses == 1)
					m_web->supports_keepalive = false;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "STATUS"
					, "%d %s", m_parser.status_code(), m_parser.message().c_str());
				auto const& headers = m_parser.headers();
				for (auto const &i : headers)
					peer_log(peer_log_alert::info, "STATUS", "   %s: %s", i.first.c_str(), i.second.c_str());
			}
#endif

			// if the status code is not one of the accepted ones, abort
			if (!aux::is_ok_status(m_parser.status_code()))
			{
				if (!m_file_requests.empty())
				{
					file_request_t const& file_req = m_file_requests.front();
					m_web->have_files.resize(t->torrent_file().num_files(), true);
					m_web->have_files.clear_bit(file_req.file_index);

#ifndef TORRENT_DISABLE_LOGGING
					peer_log(peer_log_alert::info, "MISSING_FILE", "http-code: %d | file: %d"
						, m_parser.status_code(), static_cast<int>(file_req.file_index));
#endif
				}
				handle_error(int(recv_buffer.size()));
				return;
			}

			if (aux::is_redirect(m_parser.status_code()))
			{
				handle_redirect(int(recv_buffer.size()));
				return;
			}

			m_server_string = get_peer_name(m_parser, m_host);

			recv_buffer = recv_buffer.subspan(m_body_start);

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we only received the header, no data
		if (recv_buffer.empty()) break;

		// ===================================
		// ======= RESPONSE BYTE RANGE =======
		// ===================================

		// despite the HTTP range being inclusive, range_start and range_end are
		// exclusive to fit better into C++. i.e. range_end points one byte past
		// the end of the payload
		error_code ec;
		auto const [range_start, range_end] = get_range(m_parser, ec);
		if (ec)
		{
			received_bytes(0, int(recv_buffer.size()));
			disable(ec);
			return;
		}

		TORRENT_ASSERT(!m_file_requests.empty());
		file_request_t const& file_req = m_file_requests.front();
		if (range_start != file_req.start
			|| range_end != file_req.start + file_req.length)
		{
			// the byte range in the http response is different what we expected
			received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::incoming))
			{
				peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
					, "in=(%d, %" PRId64 "-%" PRId64 ") expected=(%d, %" PRId64 "-%" PRId64 ") ]"
					, static_cast<int>(file_req.file_index), range_start, range_end
					, static_cast<int>(file_req.file_index), file_req.start, file_req.start + file_req.length - 1);
			}
#endif
			disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_parser.chunked_encoding())
		{

			// =========================
			// === CHUNKED ENCODING  ===
			// =========================

			while (m_chunk_pos >= 0 && !recv_buffer.empty())
			{
				// first deliver any payload we have in the buffer so far, ahead of
				// the next chunk header.
				if (m_chunk_pos > 0)
				{
					int const copy_size = std::min(m_chunk_pos, int(recv_buffer.size()));
					TORRENT_ASSERT(copy_size > 0);

					if (m_received_body + copy_size > file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					incoming_payload(recv_buffer.data(), copy_size);

					recv_buffer = recv_buffer.subspan(copy_size);
					m_chunk_pos -= copy_size;

					if (recv_buffer.empty()) goto done;
				}

				TORRENT_ASSERT(m_chunk_pos == 0);

				int header_size = 0;
				std::int64_t chunk_size = 0;
				span<char const> chunk_start = recv_buffer.subspan(m_chunk_pos);
				TORRENT_ASSERT(chunk_start[0] == '\r'
					|| aux::is_hex({chunk_start.data(), 1}));
				bool const ret = m_parser.parse_chunk_header(chunk_start, &chunk_size, &header_size);
				if (!ret)
				{
					received_bytes(0, int(chunk_start.size()) - m_partial_chunk_header);
					m_partial_chunk_header = int(chunk_start.size());
					goto done;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CHUNKED_ENCODING"
					, "parsed chunk: %" PRId64 " header_size: %d"
					, chunk_size, header_size);
#endif
				received_bytes(0, header_size - m_partial_chunk_header);
				m_partial_chunk_header = 0;
				TORRENT_ASSERT(chunk_size != 0
					|| int(chunk_start.size()) <= header_size || chunk_start[header_size] == 'H');
				TORRENT_ASSERT(m_body_start + m_chunk_pos < INT_MAX);
				m_chunk_pos += int(chunk_size);
				recv_buffer = recv_buffer.subspan(header_size);

				// a chunk size of zero means the request is complete. Make sure the
				// number of payload bytes we've received matches the number we
				// requested. If that's not the case, we got an invalid response.
				if (chunk_size == 0)
				{
					TORRENT_ASSERT_VAL(m_chunk_pos == 0, m_chunk_pos);

#if TORRENT_USE_ASSERTS
					span<char const> chunk = recv_buffer.subspan(m_chunk_pos);
					TORRENT_ASSERT(chunk.size() == 0 || chunk[0] == 'H');
#endif
					m_chunk_pos = -1;

					TORRENT_ASSERT(m_received_body <= file_req.length);
					if (m_received_body != file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					// we just completed an HTTP file request. pop it from m_file_requests
					m_file_requests.pop_front();
					m_parser.reset();
					m_body_start = 0;
					m_received_body = 0;
					m_chunk_pos = 0;
					m_partial_chunk_header = 0;

					// in between each file request, there may be an implicit
					// pad-file request
					handle_padfile();
					break;
				}

				// if all of the receive buffer was just consumed as chunk
				// header, we're done
				if (recv_buffer.empty()) goto done;
			}
		}
		else
		{
			// this is the simple case, where we don't have chunked encoding
			TORRENT_ASSERT(m_received_body <= file_req.length);
			int const copy_size = std::min(file_req.length - m_received_body
				, int(recv_buffer.size()));
			incoming_payload(recv_buffer.data(), copy_size);
			recv_buffer = recv_buffer.subspan(copy_size);

			TORRENT_ASSERT(m_received_body <= file_req.length);
			if (m_received_body == file_req.length)
			{
				// we just completed an HTTP file request. pop it from m_file_requests
				m_file_requests.pop_front();
				m_parser.reset();
				m_body_start = 0;
				m_received_body = 0;
				m_chunk_pos = 0;
				m_partial_chunk_header = 0;

				// in between each file request, there may be an implicit
				// pad-file request
				handle_padfile();
			}
		}

		if (recv_buffer.empty()) break;
	}
done:

	// now, remove all the bytes we've processed from the receive buffer
	m_recv_buffer.cut(int(recv_buffer.data() - m_recv_buffer.get().begin())
		, t->block_size() + request_size_overhead);
}